

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void swallowed(int first)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int local_20;
  int local_1c;
  int y;
  int x;
  int rght_ok;
  int left_ok;
  int swallower;
  int first_local;
  
  if (first == 0) {
    for (local_20 = swallowed::lasty + -1; local_20 <= swallowed::lasty + 1; local_20 = local_20 + 1
        ) {
      for (local_1c = swallowed::lastx + -1; local_1c <= swallowed::lastx + 1;
          local_1c = local_1c + 1) {
        dbuf_set_effect(local_1c,local_20,0);
      }
    }
    dbuf_set(level,(int)swallowed::lastx,(int)swallowed::lasty,(rm *)0x0,0,0,0,0,0,0,0,0,0,0);
  }
  else {
    cls();
  }
  iVar3 = monsndx((u.ustuck)->data);
  iVar3 = obfuscate_monster(iVar3);
  bVar1 = false;
  if (((0 < u.ux + -1) && (bVar1 = false, u.ux + -1 < 0x50)) && (bVar1 = false, -1 < u.uy)) {
    bVar1 = u.uy < '\x15';
  }
  bVar2 = false;
  if (((0 < u.ux + 1) && (bVar2 = false, u.ux + 1 < 0x50)) && (bVar2 = false, -1 < u.uy)) {
    bVar2 = u.uy < '\x15';
  }
  if ((('\0' < u.ux) && (u.ux < 'P')) && ((-1 < u.uy + -1 && (u.uy + -1 < 0x15)))) {
    if (bVar1) {
      iVar4 = (int)u.ux;
      iVar5 = (int)u.uy;
      iVar6 = swallow_to_effect(iVar3,0);
      dbuf_set_effect(iVar4 + -1,iVar5 + -1,iVar6);
    }
    iVar4 = (int)u.ux;
    iVar5 = (int)u.uy;
    iVar6 = swallow_to_effect(iVar3,1);
    dbuf_set_effect(iVar4,iVar5 + -1,iVar6);
    if (bVar2) {
      iVar4 = (int)u.ux;
      iVar5 = (int)u.uy;
      iVar6 = swallow_to_effect(iVar3,2);
      dbuf_set_effect(iVar4 + 1,iVar5 + -1,iVar6);
    }
  }
  if (bVar1) {
    iVar4 = (int)u.ux;
    iVar5 = (int)u.uy;
    iVar6 = swallow_to_effect(iVar3,3);
    dbuf_set_effect(iVar4 + -1,iVar5,iVar6);
  }
  display_self();
  if (bVar2) {
    iVar4 = (int)u.ux;
    iVar5 = (int)u.uy;
    iVar6 = swallow_to_effect(iVar3,4);
    dbuf_set_effect(iVar4 + 1,iVar5,iVar6);
  }
  if (((('\0' < u.ux) && (u.ux < 'P')) && (-1 < u.uy + 1)) && (u.uy + 1 < 0x15)) {
    if (bVar1) {
      iVar4 = (int)u.ux;
      iVar5 = (int)u.uy;
      iVar6 = swallow_to_effect(iVar3,5);
      dbuf_set_effect(iVar4 + -1,iVar5 + 1,iVar6);
    }
    iVar4 = (int)u.ux;
    iVar5 = (int)u.uy;
    iVar6 = swallow_to_effect(iVar3,6);
    dbuf_set_effect(iVar4,iVar5 + 1,iVar6);
    if (bVar2) {
      iVar4 = (int)u.ux;
      iVar5 = (int)u.uy;
      iVar3 = swallow_to_effect(iVar3,7);
      dbuf_set_effect(iVar4 + 1,iVar5 + 1,iVar3);
    }
  }
  swallowed::lastx = u.ux;
  swallowed::lasty = u.uy;
  return;
}

Assistant:

void swallowed(int first)
{
    static xchar lastx, lasty;	/* last swallowed position */
    int swallower, left_ok, rght_ok;

    if (first)
	cls();
    else {
	int x, y;
	/* Clear old location */
	for (y = lasty-1; y <= lasty+1; y++)
	    for (x = lastx-1; x <= lastx+1; x++)
		dbuf_set_effect(x,y,0);
	dbuf_set(level, lastx, lasty, NULL, 0,0,0,0,0,0,0,0,0,0); /* remove hero symbol */
    }

    /* Account for e.g. shuffled dragon appearances. */
    swallower = obfuscate_monster(monsndx(u.ustuck->data));
    /* assume isok(u.ux,u.uy) */
    left_ok = isok(u.ux-1,u.uy);
    rght_ok = isok(u.ux+1,u.uy);
    /*
     *  Display the hero surrounded by the monster's stomach.
     */
    if (isok(u.ux, u.uy-1)) {
	if (left_ok)
	    dbuf_set_effect(u.ux-1, u.uy-1, swallow_to_effect(swallower, S_sw_tl));
	dbuf_set_effect(u.ux, u.uy-1, swallow_to_effect(swallower, S_sw_tc));
	if (rght_ok)
	    dbuf_set_effect(u.ux+1, u.uy-1, swallow_to_effect(swallower, S_sw_tr));
    }

    if (left_ok)
	dbuf_set_effect(u.ux-1, u.uy  , swallow_to_effect(swallower, S_sw_ml));
    display_self();
    if (rght_ok)
	dbuf_set_effect(u.ux+1, u.uy  , swallow_to_effect(swallower, S_sw_mr));

    if (isok(u.ux, u.uy+1)) {
	if (left_ok)
	    dbuf_set_effect(u.ux-1, u.uy+1, swallow_to_effect(swallower, S_sw_bl));
	dbuf_set_effect(u.ux, u.uy+1, swallow_to_effect(swallower, S_sw_bc));
	if (rght_ok)
	    dbuf_set_effect(u.ux+1, u.uy+1, swallow_to_effect(swallower, S_sw_br));
    }

    /* Update the swallowed position. */
    lastx = u.ux;
    lasty = u.uy;
}